

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O2

void __thiscall
Js::ByteCodeWriter::PatchablePropertyWithThisPtr
          (ByteCodeWriter *this,OpCode op,RegSlot value,RegSlot instance,RegSlot thisInstance,
          uint cacheId,bool isCtor,bool registerCacheIdForCall)

{
  code *pcVar1;
  bool bVar2;
  RegSlot instance_00;
  RegSlot value2;
  undefined4 *puVar3;
  Phase tag;
  PropertyIdIndexType propertyIdIndex;
  CacheIdUnit local_48;
  CacheIdUnit unit;
  RegSlot local_38;
  OpCode local_32 [4];
  OpCode op_local;
  
  unit._4_4_ = cacheId;
  local_32[0] = op;
  CheckOpen(this);
  CheckOp(this,op,(OpLayoutType)0x39);
  bVar2 = OpCodeAttr::HasMultiSizeLayout(op);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    unit.cacheId = thisInstance;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x890,"(OpCodeAttr::HasMultiSizeLayout(op))",
                                "OpCodeAttr::HasMultiSizeLayout(op)");
    if (!bVar2) goto LAB_007cf8ac;
    *puVar3 = 0;
    thisInstance = unit.cacheId;
  }
  local_38 = ConsumeReg(this,value);
  instance_00 = ConsumeReg(this,instance);
  value2 = ConsumeReg(this,thisInstance);
  propertyIdIndex = unit._4_4_;
  if ((op == StSuperFldStrict) || (op == StSuperFld)) {
    bVar2 = DoDynamicProfileOpcode(this,ProfileBasedFldFastPathPhase,false);
    propertyIdIndex = unit._4_4_;
    if (!bVar2) {
      bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false);
      if (!bVar2) {
        tag = ObjTypeSpecPhase;
LAB_007cf78d:
        bVar2 = DoDynamicProfileOpcode(this,tag,false);
        if (!bVar2) goto LAB_007cf7f8;
      }
    }
LAB_007cf798:
    OpCodeUtil::ConvertNonCallOpToProfiled(local_32);
  }
  else {
    if (op == LdSuperFld) {
      if (registerCacheIdForCall && isCtor) {
        local_48.cacheId = unit._4_4_;
        local_48.isRootObjectCache = false;
        bVar2 = JsUtil::
                BaseDictionary<unsigned_int,_Js::ByteCodeWriter::CacheIdUnit,_Memory::ArenaAllocator,_DictionarySizePolicy<PrimePolicy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::TryGetValue<unsigned_int>(this->callRegToLdFldCacheIndexMap,&local_38,&local_48);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar3 = 1;
          bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                      ,0x89e,
                                      "(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit))",
                                      "!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit)");
          if (!bVar2) goto LAB_007cf8ac;
          *puVar3 = 0;
        }
        JsUtil::
        BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
        ::
        Insert<(JsUtil::BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                  ((BaseDictionary<unsigned_int,Js::ByteCodeWriter::CacheIdUnit,Memory::ArenaAllocator,DictionarySizePolicy<PrimePolicy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                    *)this->callRegToLdFldCacheIndexMap,&local_38,&local_48);
      }
      bVar2 = DoDynamicProfileOpcode(this,AggressiveIntTypeSpecPhase,false);
      if (!bVar2) {
        bVar2 = DoDynamicProfileOpcode(this,FloatTypeSpecPhase,false);
        if (!bVar2) {
          bVar2 = DoDynamicProfileOpcode(this,ObjTypeSpecPhase,false);
          if (!bVar2) {
            bVar2 = DoDynamicProfileOpcode(this,InlinePhase,false);
            if (!bVar2) {
              tag = ProfileBasedFldFastPathPhase;
              goto LAB_007cf78d;
            }
          }
        }
      }
      goto LAB_007cf798;
    }
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x8b5,"(false)",
                                "The specified OpCode is not intended for patchable super field-access"
                               );
    if (!bVar2) goto LAB_007cf8ac;
    *puVar3 = 0;
    propertyIdIndex = unit._4_4_;
  }
LAB_007cf7f8:
  bVar2 = TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
                    (this,local_32[0],local_38,instance_00,propertyIdIndex,value2);
  if (!bVar2) {
    bVar2 = TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
                      (this,local_32[0],local_38,instance_00,propertyIdIndex,value2);
    if (!bVar2) {
      bVar2 = TryWriteElementC2<Js::LayoutSizePolicy<(Js::LayoutSize)2>>
                        (this,local_32[0],local_38,instance_00,propertyIdIndex,value2);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar3 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                    ,0x8b9,"(success)","success");
        if (!bVar2) {
LAB_007cf8ac:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar3 = 0;
      }
    }
  }
  return;
}

Assistant:

void ByteCodeWriter::PatchablePropertyWithThisPtr(OpCode op, RegSlot value, RegSlot instance, RegSlot thisInstance, uint cacheId, bool isCtor, bool registerCacheIdForCall)
    {
        CheckOpen();
        CheckOp(op, OpLayoutType::ElementC2);
        Assert(OpCodeAttr::HasMultiSizeLayout(op));

        value = ConsumeReg(value);
        instance = ConsumeReg(instance);
        thisInstance = ConsumeReg(thisInstance);

        switch (op)
        {
        case OpCode::LdSuperFld:
            if (isCtor) // The symbol loaded by this LdSuperFld will be used as a constructor
            {
                if (registerCacheIdForCall)
                {
                    CacheIdUnit unit(cacheId);
                    Assert(!callRegToLdFldCacheIndexMap->TryGetValue(value, &unit));
                    callRegToLdFldCacheIndexMap->Add(value, unit);
                }
            }
            if (DoDynamicProfileOpcode(AggressiveIntTypeSpecPhase) ||
                DoDynamicProfileOpcode(FloatTypeSpecPhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        case OpCode::StSuperFld:
        case OpCode::StSuperFldStrict:
            if (DoDynamicProfileOpcode(ProfileBasedFldFastPathPhase) ||
                DoDynamicProfileOpcode(InlinePhase) ||
                DoDynamicProfileOpcode(ObjTypeSpecPhase))
            {
                OpCodeUtil::ConvertNonCallOpToProfiled(op);
            }
            break;
        default:
            AssertMsg(false, "The specified OpCode is not intended for patchable super field-access");
            break;
        }

        MULTISIZE_LAYOUT_WRITE(ElementC2, op, value, instance, cacheId, thisInstance);
    }